

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O1

string * __thiscall
StringInstance::op_eraseFromIndex
          (string *__return_storage_ptr__,StringInstance *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments)

{
  string *value;
  ulong uVar1;
  int iVar2;
  undefined8 *puVar3;
  long *extraout_RDX;
  char *pcVar4;
  char *pcVar5;
  ulong uVar6;
  IntegerInstance IStack_118;
  string *psStack_b8;
  IntegerInstance *pIStack_b0;
  IntegerInstance local_80;
  
  value = (arguments->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(arguments->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)value == 0x20) {
    IntegerInstance::IntegerInstance(&local_80,value);
    uVar6 = (ulong)local_80._value;
    CharacterInstance::~CharacterInstance((CharacterInstance *)&local_80);
    if ((-1 < (long)uVar6) &&
       (uVar1 = (this->_value)._M_string_length, local_80._value <= (int)uVar1)) {
      if (uVar6 <= uVar1) {
        (this->_value)._M_string_length = uVar6;
        (this->_value)._M_dataplus._M_p[uVar6] = '\0';
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"null","");
        return __return_storage_ptr__;
      }
      pcVar5 = "%s: __pos (which is %zu) > this->size() (which is %zu)";
      pcVar4 = "basic_string::erase";
      std::__throw_out_of_range_fmt
                ("%s: __pos (which is %zu) > this->size() (which is %zu)","basic_string::erase",
                 uVar6);
      psStack_b8 = __return_storage_ptr__;
      pIStack_b0 = &local_80;
      if (extraout_RDX[1] - *extraout_RDX == 0x40) {
        IntegerInstance::IntegerInstance(&IStack_118,(string *)*extraout_RDX);
        iVar2 = IStack_118._value;
        uVar6 = (ulong)IStack_118._value;
        CharacterInstance::~CharacterInstance((CharacterInstance *)&IStack_118);
        IntegerInstance::IntegerInstance(&IStack_118,(string *)(*extraout_RDX + 0x20));
        CharacterInstance::~CharacterInstance((CharacterInstance *)&IStack_118);
        if ((((-1 < (long)uVar6) && (iVar2 <= *(int *)(pcVar4 + 0x60))) && (-1 < IStack_118._value))
           && ((IStack_118._value <= *(int *)(pcVar4 + 0x60) && (-1 < IStack_118._value - iVar2))))
        {
          std::__cxx11::string::erase((ulong)(pcVar4 + 0x58),uVar6);
          (((string *)pcVar5)->_M_dataplus)._M_p = (pointer)&((string *)pcVar5)->field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)pcVar5,"null","");
          return (string *)pcVar5;
        }
        puVar3 = (undefined8 *)__cxa_allocate_exception(8);
        pcVar4 = "RuntimeError: invalid argument.";
      }
      else {
        puVar3 = (undefined8 *)__cxa_allocate_exception(8);
        pcVar4 = "RuntimeError: wrong number of arguments.";
      }
      *puVar3 = pcVar4;
      __cxa_throw(puVar3,&char_const*::typeinfo,0);
    }
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    pcVar4 = "RuntimeError: invalid argument.";
  }
  else {
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    pcVar4 = "RuntimeError: wrong number of arguments.";
  }
  *puVar3 = pcVar4;
  __cxa_throw(puVar3,&char_const*::typeinfo,0);
}

Assistant:

std::string StringInstance::op_eraseFromIndex(const std::vector<std::string>& arguments) {
    if (arguments.size() != 1)
        throw EXC_WRONG_NUMBER_OF_ARGUMENTS;
    int from_index = IntegerInstance(arguments[0]).value();
    if (from_index < 0 || from_index > int(_value.size()))
        throw EXC_INVALID_ARGUMENT;
    _value.erase(from_index);
    return "null";
}